

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMap.c
# Opt level: O1

Map_Man_t *
Abc_NtkToMap(Abc_Ntk_t *pNtk,double DelayTarget,int fRecovery,float *pSwitching,int fVerbose)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  long *plVar4;
  long *plVar5;
  long lVar6;
  long *plVar7;
  Map_Man_t *p;
  char **ppNames;
  Scl_Con_t *pSVar8;
  Abc_Time_t *pAVar9;
  Map_Time_t *pMVar10;
  Map_Node_t *pMVar11;
  Abc_Obj_t *pAVar12;
  Map_Node_t **ppMVar13;
  Vec_Ptr_t *pVVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  char *__assertion;
  ulong uVar18;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMap.c"
                  ,0x10d,"Map_Man_t *Abc_NtkToMap(Abc_Ntk_t *, double, int, float *, int)");
  }
  p = Map_ManCreate((pNtk->vPis->nSize + pNtk->nObjCounts[8]) - pNtk->nBarBufs,
                    (pNtk->nObjCounts[8] - pNtk->nBarBufs) + pNtk->vPos->nSize,fVerbose);
  if (p == (Map_Man_t *)0x0) {
    return (Map_Man_t *)0x0;
  }
  Map_ManSetAreaRecovery(p,fRecovery);
  ppNames = Abc_NtkCollectCioNames(pNtk,1);
  Map_ManSetOutputNames(p,ppNames);
  Map_ManSetDelayTarget(p,(float)DelayTarget);
  iVar17 = 0;
  pSVar8 = Scl_ConReadMan();
  if (pSVar8 == (Scl_Con_t *)0x0) {
LAB_002da192:
    pAVar9 = Abc_NtkGetCiArrivalTimes(pNtk);
    pMVar10 = Abc_NtkMapCopyCiArrival(pNtk,pAVar9);
  }
  else {
    pSVar8 = Scl_ConReadMan();
    iVar1 = (pSVar8->vInArrs).nSize;
    if (0 < (long)iVar1) {
      lVar16 = 0;
      iVar17 = 0;
      do {
        iVar17 = iVar17 + (uint)((pSVar8->vInArrs).pArray[lVar16] == 0);
        lVar16 = lVar16 + 1;
      } while (iVar1 != lVar16);
    }
    if (iVar17 == iVar1) goto LAB_002da192;
    pMVar10 = Abc_NtkMapCopyCiArrivalCon(pNtk);
  }
  Map_ManSetInputArrivals(p,pMVar10);
  iVar17 = 0;
  pSVar8 = Scl_ConReadMan();
  if (pSVar8 != (Scl_Con_t *)0x0) {
    pSVar8 = Scl_ConReadMan();
    iVar1 = (pSVar8->vOutReqs).nSize;
    if (0 < (long)iVar1) {
      lVar16 = 0;
      iVar17 = 0;
      do {
        iVar17 = iVar17 + (uint)((pSVar8->vOutReqs).pArray[lVar16] == 0);
        lVar16 = lVar16 + 1;
      } while (iVar1 != lVar16);
    }
    if (iVar17 != iVar1) {
      pMVar10 = Abc_NtkMapCopyCoRequiredCon(pNtk);
      goto LAB_002da21e;
    }
  }
  pAVar9 = Abc_NtkGetCoRequiredTimes(pNtk);
  pMVar10 = Abc_NtkMapCopyCoRequired(pNtk,pAVar9);
LAB_002da21e:
  Map_ManSetOutputRequireds(p,pMVar10);
  Abc_NtkCleanCopy(pNtk);
  pMVar11 = Map_ManReadConst1(p);
  pAVar12 = Abc_AigConst1(pNtk);
  (pAVar12->field_6).pCopy = (Abc_Obj_t *)pMVar11;
  pVVar14 = pNtk->vCis;
  uVar15 = (ulong)(uint)pVVar14->nSize;
  if (0 < pVVar14->nSize) {
    uVar18 = 0;
    do {
      if (uVar18 == (uint)((int)uVar15 - pNtk->nBarBufs)) break;
      pvVar3 = pVVar14->pArray[uVar18];
      ppMVar13 = Map_ManReadInputs(p);
      pMVar11 = ppMVar13[uVar18];
      *(Map_Node_t **)((long)pvVar3 + 0x40) = pMVar11;
      if (pSwitching != (float *)0x0) {
        Map_NodeSetSwitching(pMVar11,pSwitching[*(int *)((long)pvVar3 + 0x10)]);
      }
      uVar18 = uVar18 + 1;
      pVVar14 = pNtk->vCis;
      uVar15 = (ulong)pVVar14->nSize;
    } while ((long)uVar18 < (long)uVar15);
  }
  pVVar14 = Abc_AigDfsMap(pNtk);
  if (0 < pVVar14->nSize) {
    lVar16 = 0;
    do {
      plVar4 = (long *)pVVar14->pArray[lVar16];
      uVar2 = *(uint *)((long)plVar4 + 0x14);
      if ((uVar2 & 0xf) == 7) {
        lVar6 = *(long *)(*(long *)(*plVar4 + 0x20) + 8);
        pMVar11 = Map_NodeAnd(p,(Map_Node_t *)
                                ((ulong)(uVar2 >> 10 & 1) ^
                                *(ulong *)(*(long *)(lVar6 + (long)*(int *)plVar4[4] * 8) + 0x40)),
                              (Map_Node_t *)
                              ((ulong)(uVar2 >> 0xb & 1) ^
                              *(ulong *)(*(long *)(lVar6 + (long)((int *)plVar4[4])[1] * 8) + 0x40))
                             );
        if (plVar4[8] != 0) {
          __assert_fail("pNode->pCopy == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMap.c"
                        ,0x13e,"Map_Man_t *Abc_NtkToMap(Abc_Ntk_t *, double, int, float *, int)");
        }
        plVar4[8] = (long)pMVar11;
        if (pSwitching != (float *)0x0) {
          Map_NodeSetSwitching(pMVar11,pSwitching[(int)plVar4[2]]);
        }
        if (((ulong)plVar4 & 1) != 0) {
          __assertion = "!Abc_ObjIsComplement(pNode)";
LAB_002da4e9:
          __assert_fail(__assertion,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                        ,400,"int Abc_AigNodeIsChoice(Abc_Obj_t *)");
        }
        if (*(int *)*plVar4 != 3) {
          __assertion = "Abc_NtkIsStrash(pNode->pNtk)";
          goto LAB_002da4e9;
        }
        if ((plVar4[7] != 0) && (0 < *(int *)((long)plVar4 + 0x2c))) {
          plVar5 = plVar4;
          for (plVar7 = (long *)plVar4[7]; plVar7 != (long *)0x0; plVar7 = (long *)plVar7[7]) {
            Map_NodeSetNextE((Map_Node_t *)plVar5[8],(Map_Node_t *)plVar7[8]);
            Map_NodeSetRepr((Map_Node_t *)plVar7[8],(Map_Node_t *)plVar4[8]);
            plVar5 = plVar7;
          }
        }
      }
      else {
        if ((uVar2 & 0xf) != 8) {
          __assert_fail("Abc_ObjIsNode(pNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMap.c"
                        ,0x139,"Map_Man_t *Abc_NtkToMap(Abc_Ntk_t *, double, int, float *, int)");
        }
        plVar5 = *(long **)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) + (long)*(int *)plVar4[4] * 8);
        pMVar11 = Map_NodeBuf(p,(Map_Node_t *)
                                ((ulong)(*(uint *)((long)plVar5 + 0x14) >> 10 & 1) ^
                                *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                                                    (long)*(int *)plVar5[4] * 8) + 0x40)));
        *(Map_Node_t **)
         (*(long *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) + (long)*(int *)plVar4[6] * 8) + 0x40)
             = pMVar11;
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < pVVar14->nSize);
  }
  iVar17 = Map_ManReadBufNum(p);
  if (iVar17 != pNtk->nBarBufs) {
    __assert_fail("Map_ManReadBufNum(pMan) == pNtk->nBarBufs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMap.c"
                  ,0x14b,"Map_Man_t *Abc_NtkToMap(Abc_Ntk_t *, double, int, float *, int)");
  }
  if (pVVar14->pArray != (void **)0x0) {
    free(pVVar14->pArray);
    pVVar14->pArray = (void **)0x0;
  }
  if (pVVar14 != (Vec_Ptr_t *)0x0) {
    free(pVVar14);
  }
  pVVar14 = pNtk->vCos;
  uVar15 = (ulong)(uint)pVVar14->nSize;
  if (0 < pVVar14->nSize) {
    uVar18 = 0;
    do {
      if (uVar18 == (uint)((int)uVar15 - pNtk->nBarBufs)) {
        return p;
      }
      plVar4 = (long *)pVVar14->pArray[uVar18];
      uVar2 = *(uint *)((long)plVar4 + 0x14);
      uVar15 = *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                   (long)*(int *)plVar4[4] * 8) + 0x40);
      ppMVar13 = Map_ManReadOutputs(p);
      ppMVar13[uVar18] = (Map_Node_t *)(uVar2 >> 10 & 1 ^ uVar15);
      uVar18 = uVar18 + 1;
      pVVar14 = pNtk->vCos;
      uVar15 = (ulong)pVVar14->nSize;
    } while ((long)uVar18 < (long)uVar15);
  }
  return p;
}

Assistant:

Map_Man_t * Abc_NtkToMap( Abc_Ntk_t * pNtk, double DelayTarget, int fRecovery, float * pSwitching, int fVerbose )
{
    Map_Man_t * pMan;
    Map_Node_t * pNodeMap;
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pNode, * pFanin, * pPrev;
    int i;

    assert( Abc_NtkIsStrash(pNtk) );

    // start the mapping manager and set its parameters
    pMan = Map_ManCreate( Abc_NtkPiNum(pNtk) + Abc_NtkLatchNum(pNtk) - pNtk->nBarBufs, Abc_NtkPoNum(pNtk) + Abc_NtkLatchNum(pNtk) - pNtk->nBarBufs, fVerbose );
    if ( pMan == NULL )
        return NULL;
    Map_ManSetAreaRecovery( pMan, fRecovery );
    Map_ManSetOutputNames( pMan, Abc_NtkCollectCioNames(pNtk, 1) );
    Map_ManSetDelayTarget( pMan, (float)DelayTarget );

    // set arrival and requireds
    if ( Scl_ConIsRunning() && Scl_ConHasInArrs() )
        Map_ManSetInputArrivals( pMan, Abc_NtkMapCopyCiArrivalCon(pNtk) );
    else
        Map_ManSetInputArrivals( pMan, Abc_NtkMapCopyCiArrival(pNtk, Abc_NtkGetCiArrivalTimes(pNtk)) );
    if ( Scl_ConIsRunning() && Scl_ConHasOutReqs() )
        Map_ManSetOutputRequireds( pMan, Abc_NtkMapCopyCoRequiredCon(pNtk) );
    else
        Map_ManSetOutputRequireds( pMan, Abc_NtkMapCopyCoRequired(pNtk, Abc_NtkGetCoRequiredTimes(pNtk)) );

    // create PIs and remember them in the old nodes
    Abc_NtkCleanCopy( pNtk );
    Abc_AigConst1(pNtk)->pCopy = (Abc_Obj_t *)Map_ManReadConst1(pMan);
    Abc_NtkForEachCi( pNtk, pNode, i )
    {
        if ( i == Abc_NtkCiNum(pNtk) - pNtk->nBarBufs )
            break;
        pNodeMap = Map_ManReadInputs(pMan)[i];
        pNode->pCopy = (Abc_Obj_t *)pNodeMap;
        if ( pSwitching )
            Map_NodeSetSwitching( pNodeMap, pSwitching[pNode->Id] );
    }

    // load the AIG into the mapper
    vNodes = Abc_AigDfsMap( pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        if ( Abc_ObjIsLatch(pNode) )
        {
            pFanin = Abc_ObjFanin0(pNode);
            pNodeMap = Map_NodeBuf( pMan, Map_NotCond( Abc_ObjFanin0(pFanin)->pCopy, (int)Abc_ObjFaninC0(pFanin) ) );
            Abc_ObjFanout0(pNode)->pCopy = (Abc_Obj_t *)pNodeMap;
            continue;
        }
        assert( Abc_ObjIsNode(pNode) );
        // add the node to the mapper
        pNodeMap = Map_NodeAnd( pMan, 
            Map_NotCond( Abc_ObjFanin0(pNode)->pCopy, (int)Abc_ObjFaninC0(pNode) ),
            Map_NotCond( Abc_ObjFanin1(pNode)->pCopy, (int)Abc_ObjFaninC1(pNode) ) );
        assert( pNode->pCopy == NULL );
        // remember the node
        pNode->pCopy = (Abc_Obj_t *)pNodeMap;
        if ( pSwitching )
            Map_NodeSetSwitching( pNodeMap, pSwitching[pNode->Id] );
        // set up the choice node
        if ( Abc_AigNodeIsChoice( pNode ) )
            for ( pPrev = pNode, pFanin = (Abc_Obj_t *)pNode->pData; pFanin; pPrev = pFanin, pFanin = (Abc_Obj_t *)pFanin->pData )
            {
                Map_NodeSetNextE( (Map_Node_t *)pPrev->pCopy, (Map_Node_t *)pFanin->pCopy );
                Map_NodeSetRepr( (Map_Node_t *)pFanin->pCopy, (Map_Node_t *)pNode->pCopy );
            }
    }
    assert( Map_ManReadBufNum(pMan) == pNtk->nBarBufs );
    Vec_PtrFree( vNodes );

    // set the primary outputs in the required phase
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        if ( i == Abc_NtkCoNum(pNtk) - pNtk->nBarBufs )
            break;
        Map_ManReadOutputs(pMan)[i] = Map_NotCond( (Map_Node_t *)Abc_ObjFanin0(pNode)->pCopy, (int)Abc_ObjFaninC0(pNode) );
    }
    return pMan;
}